

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

int net_tcp_connect(NETSOCKET sock,NETADDR *a)

{
  long lVar1;
  int iVar2;
  socklen_t __len;
  long in_FS_OFFSET;
  sockaddr_in addr;
  
  iVar2 = sock.ipv6sock;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((a->type & 1) == 0) {
    if ((a->type & 2) == 0) {
      iVar2 = -1;
      goto LAB_001c090b;
    }
    netaddr_to_sockaddr_in6(a,(sockaddr_in6 *)&addr);
    __len = 0x1c;
  }
  else {
    netaddr_to_sockaddr_in(a,&addr);
    __len = 0x10;
    iVar2 = sock.ipv4sock;
  }
  iVar2 = connect(iVar2,(sockaddr *)&addr,__len);
LAB_001c090b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int net_tcp_connect(NETSOCKET sock, const NETADDR *a)
{
	if(a->type&NETTYPE_IPV4)
	{
		struct sockaddr_in addr;
		netaddr_to_sockaddr_in(a, &addr);
		return connect(sock.ipv4sock, (struct sockaddr *)&addr, sizeof(addr));
	}

	if(a->type&NETTYPE_IPV6)
	{
		struct sockaddr_in6 addr;
		netaddr_to_sockaddr_in6(a, &addr);
		return connect(sock.ipv6sock, (struct sockaddr *)&addr, sizeof(addr));
	}

	return -1;
}